

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaK_jump(FuncState *fs)

{
  int local_18;
  int local_14;
  int j;
  int jpc;
  FuncState *fs_local;
  
  local_14 = fs->jpc;
  fs->jpc = -1;
  _j = fs;
  local_18 = luaK_codeABx(fs,OP_JMP,0,0x1fffe);
  luaK_concat(_j,&local_18,local_14);
  return local_18;
}

Assistant:

static int luaK_jump(FuncState*fs){
int jpc=fs->jpc;
int j;
fs->jpc=(-1);
j=luaK_codeAsBx(fs,OP_JMP,0,(-1));
luaK_concat(fs,&j,jpc);
return j;
}